

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_matrix.hpp
# Opt level: O0

exp_double
ising::square::transfer_matrix::product_D<std::vector<double,std::allocator<double>>>
          (double beta,vector<double,_std::allocator<double>_> *inter_x,
          vector<double,_std::allocator<double>_> *field,vector<double,_std::allocator<double>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  reference pdVar4;
  reference pvVar5;
  vector<double,_std::allocator<double>_> *in_RCX;
  int iVar6;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 in_RDI;
  vector<double,_std::allocator<double>_> *pvVar7;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar8;
  double extraout_XMM0_Qa_00;
  value_type extraout_XMM0_Qa_01;
  exp_double eVar9;
  int s_1;
  double elem_1;
  int c_1;
  double offset_1;
  int s;
  int s1;
  int s0;
  int b_1;
  double elem;
  int c;
  double offset;
  int b;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> weight;
  int dim;
  int width;
  exp_double *normal;
  self_ *in_stack_fffffffffffffe78;
  exp_number<double> *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
  *in_stack_fffffffffffffea0;
  uint local_c4;
  double local_c0;
  uint local_b4;
  int local_98;
  byte local_94;
  byte local_90;
  int local_8c;
  double local_88;
  uint local_7c;
  int local_60;
  vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> local_48;
  int local_30;
  int local_2c;
  vector<double,_std::allocator<double>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  double local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  local_2c._0_1_ = (byte)sVar1;
  local_30 = 1 << ((byte)local_2c & 0x1f);
  local_2c = (int)sVar1;
  standards::exp_number<double>::exp_number
            (in_stack_fffffffffffffe80,(value_type)in_stack_fffffffffffffe78);
  std::allocator<boost::array<double,_2UL>_>::allocator
            ((allocator<boost::array<double,_2UL>_> *)0x103076);
  std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::vector
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::allocator<boost::array<double,_2UL>_>::~allocator
            ((allocator<boost::array<double,_2UL>_> *)0x1030a2);
  for (local_60 = 0; local_60 < local_2c; local_60 = local_60 + 1) {
    pvVar7 = local_18;
    std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_60);
    std::abs((int)pvVar7);
    standards::exp_number<double>::exp_number
              (in_stack_fffffffffffffe80,(value_type)in_stack_fffffffffffffe78);
    standards::exp_number<double>::operator*=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    dVar8 = local_10;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_60);
    dVar8 = exp(dVar8 * *pvVar2 - extraout_XMM0_Qa);
    pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
             operator[](&local_48,(long)local_60);
    pdVar4 = boost::array<double,_2UL>::operator[](pvVar3,0);
    *pdVar4 = dVar8;
    dVar8 = -local_10;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_60);
    dVar8 = exp(dVar8 * *pvVar2 - extraout_XMM0_Qa);
    pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
             operator[](&local_48,(long)local_60);
    pdVar4 = boost::array<double,_2UL>::operator[](pvVar3,1);
    *pdVar4 = dVar8;
  }
  for (local_7c = 0; (int)local_7c < local_30; local_7c = local_7c + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)(int)local_7c);
    local_88 = *pvVar5;
    for (local_8c = 0; local_8c < local_2c; local_8c = local_8c + 1) {
      iVar6 = (local_8c + 1) % local_2c;
      pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
               operator[](&local_48,(long)local_8c);
      local_90 = (byte)local_8c;
      local_94 = (byte)iVar6;
      pdVar4 = boost::array<double,_2UL>::operator[]
                         (pvVar3,(ulong)((local_7c >> (local_90 & 0x1f) ^
                                         local_7c >> (local_94 & 0x1f)) & 1));
      local_88 = *pdVar4 * local_88;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)(int)local_7c);
    *pvVar5 = local_88;
  }
  sVar1 = std::vector<double,_std::allocator<double>_>::size(local_20);
  if (sVar1 != 0) {
    for (local_98 = 0; local_98 < local_2c; local_98 = local_98 + 1) {
      pvVar7 = local_20;
      std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_98);
      std::abs((int)pvVar7);
      standards::exp_number<double>::exp_number
                (in_stack_fffffffffffffe80,(value_type)in_stack_fffffffffffffe78);
      standards::exp_number<double>::operator*=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78)
      ;
      dVar8 = local_10;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_98);
      dVar8 = exp(dVar8 * *pvVar2 - extraout_XMM0_Qa_00);
      pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
               operator[](&local_48,(long)local_98);
      pdVar4 = boost::array<double,_2UL>::operator[](pvVar3,0);
      *pdVar4 = dVar8;
      dVar8 = -local_10;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_98);
      in_stack_fffffffffffffe90 = (allocator_type *)exp(dVar8 * *pvVar2 - extraout_XMM0_Qa_00);
      pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::
               operator[](&local_48,(long)local_98);
      pdVar4 = boost::array<double,_2UL>::operator[](pvVar3,1);
      *pdVar4 = (double)in_stack_fffffffffffffe90;
    }
    for (local_b4 = 0; (int)local_b4 < local_30; local_b4 = local_b4 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_28,(long)(int)local_b4);
      local_c0 = *pvVar5;
      for (local_c4 = 0; (int)local_c4 < local_2c; local_c4 = local_c4 + 1) {
        pvVar3 = std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>
                 ::operator[](&local_48,(long)(int)local_c4);
        pdVar4 = boost::array<double,_2UL>::operator[]
                           (pvVar3,(ulong)((local_b4 >> (local_c4 & 0x1f) & 1) != 0));
        local_c0 = *pdVar4 * local_c0;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_28,(long)(int)local_b4);
      *pvVar5 = local_c0;
    }
  }
  std::vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_>::~vector
            ((vector<boost::array<double,_2UL>,_std::allocator<boost::array<double,_2UL>_>_> *)
             in_stack_fffffffffffffe90);
  eVar9._8_8_ = in_RDI;
  eVar9.log_ = extraout_XMM0_Qa_01;
  return eVar9;
}

Assistant:

static exp_double product_D(double beta, std::vector<double> const& inter_x,
                                   std::vector<double> const& field, VEC& v) {
    int width = inter_x.size();
    int dim = 1 << width;
    exp_double normal = 1;
    std::vector<boost::array<double, 2> > weight(width);
    for (int b = 0; b < width; ++b) {
      double offset = std::abs(beta * inter_x[b]);
      normal *= standards::exp_number<double>(offset);
      weight[b][0] = std::exp(beta * inter_x[b] - offset);
      weight[b][1] = std::exp(-beta * inter_x[b] - offset);
    }
    for (int c = 0; c < dim; ++c) {
      double elem = v[c];
      for (int b = 0; b < width; ++b) {
        int s0 = b;
        int s1 = (b+1) % width;
        elem *= weight[b][((c >> s0) & 1) ^ ((c >> s1) & 1)];
      }
      v[c] = elem;
    }
    if (field.size()) {
      for (int s = 0; s < width; ++s) {
        double offset = std::abs(beta * field[s]);
        normal *= standards::exp_number<double>(offset);
        weight[s][0] = std::exp(beta * field[s] - offset);
        weight[s][1] = std::exp(-beta * field[s] - offset);
      }
      for (int c = 0; c < dim; ++c) {
        double elem = v[c];
        for (int s = 0; s < width; ++s) elem *= weight[s][((c >> s) & 1)];
        v[c] = elem;
      }
    }
    return normal;
  }